

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peer.cpp
# Opt level: O0

string * __thiscall Peer::name_abi_cxx11_(string *__return_storage_ptr__,Peer *this)

{
  Peer *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_name);
  return __return_storage_ptr__;
}

Assistant:

std::string Peer::name() const
{
    return m_name;
}